

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_create(uint flags)

{
  size_t size;
  secp256k1_context *prealloc;
  secp256k1_context *psVar1;
  
  size = secp256k1_context_preallocated_size(flags);
  prealloc = (secp256k1_context *)checked_malloc(&default_error_callback,size);
  psVar1 = secp256k1_context_preallocated_create(prealloc,flags);
  if (psVar1 == (secp256k1_context *)0x0) {
    free(prealloc);
    prealloc = (secp256k1_context *)0x0;
  }
  return prealloc;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}